

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonPP.cpp
# Opt level: O1

Value * ccd::Json::arrayFromString(Value *__return_storage_ptr__,string *jsonString)

{
  byte bVar1;
  byte *pbVar2;
  pointer pcVar3;
  double dVar4;
  pointer pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  Type TVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  _Node *p_Var12;
  int *piVar13;
  ostream *poVar14;
  undefined8 uVar15;
  undefined1 *puVar16;
  pointer pVVar17;
  char *pcVar18;
  pointer pVVar19;
  byte *pbVar20;
  byte *pbVar21;
  char cVar22;
  int iVar23;
  pointer pVVar24;
  int iVar25;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  Value subObject;
  list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> arrayValues;
  double value_1;
  undefined1 local_c8 [16];
  undefined1 local_b8 [48];
  _List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> local_88;
  double local_68;
  string local_60;
  Value *local_40;
  double local_38;
  
  setlocale(1,"C");
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node._M_size = 0;
  cVar22 = (char)jsonString;
  local_88._M_impl._M_node.super__List_node_base._M_prev =
       local_88._M_impl._M_node.super__List_node_base._M_next;
  lVar9 = std::__cxx11::string::find(cVar22,0x5b);
  lVar10 = std::__cxx11::string::rfind(cVar22,0x5d);
  if ((lVar9 == -1) || (lVar10 == -1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"can\'t tell beginning or end of array",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    local_b8._0_4_ = 0xd0a0920;
    local_c8._8_8_ = 1.97626258336499e-323;
    local_b8._4_4_ = local_b8._4_4_ & 0xffffff00;
    pVVar17 = (pointer)(lVar9 + 1);
    local_c8._0_8_ = (pointer)local_b8;
    pcVar11 = (char *)std::__cxx11::string::find_first_not_of
                                ((char *)jsonString,(ulong)local_b8,(ulong)pVVar17);
    pVVar7 = __return_storage_ptr__;
    pVVar6 = local_40;
    if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
      operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
      pVVar7 = __return_storage_ptr__;
      pVVar6 = local_40;
    }
    while (local_40 = pVVar7, pcVar11 != (char *)0xffffffffffffffff) {
      pbVar2 = (byte *)jsonString->_M_string_length;
      if (pbVar2 <= pcVar11) goto LAB_0010fa8d;
      pcVar3 = (jsonString->_M_dataplus)._M_p;
      bVar1 = pcVar11[(long)pcVar3];
      if (bVar1 != 0x22) {
        if (bVar1 == 0x7b) {
          std::__cxx11::string::substr((ulong)local_c8,(ulong)jsonString);
          pcVar18 = pcVar11;
          if ((double)local_c8._8_8_ == 0.0) {
            iVar23 = 0;
            iVar25 = 0;
          }
          else {
            iVar25 = 0;
            iVar23 = 0;
            puVar16 = (undefined1 *)0x0;
            do {
              iVar25 = (uint)(*(char *)(local_c8._0_8_ + (long)puVar16) == '{') + iVar25;
              iVar23 = (uint)(*(char *)(local_c8._0_8_ + (long)puVar16) == '}') + iVar23;
              pcVar18 = pcVar18 + (iVar25 != iVar23);
              if (iVar25 == iVar23) break;
              bVar26 = (undefined1 *)(local_c8._8_8_ + -1) != puVar16;
              puVar16 = puVar16 + 1;
            } while (bVar26);
          }
          if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
            operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
          }
          if (iVar25 == iVar23) {
            std::__cxx11::string::substr((ulong)&local_60,(ulong)jsonString);
            objectFromString((Value *)local_c8,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            TVar8 = Value::type((Value *)local_c8);
            bVar26 = TVar8 != Null;
            if (TVar8 == Null) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"subObject ist nullptr",0x15);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
              std::ostream::put('P');
              std::ostream::flush();
              Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
            }
            else {
              p_Var12 = std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                        _M_create_node<ccd::Json::Value>
                                  ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                   &local_88,(Value *)local_c8);
              std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
              local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
              pcVar11 = pcVar18 + 1;
            }
            std::__detail::__variant::
            _Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
            ::~_Variant_storage((_Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                                 *)(local_c8 + 8));
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"could not tell end of new subObject",0x23);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
            std::ostream::put('P');
            std::ostream::flush();
            bVar26 = false;
            Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          }
          if (bVar26) goto LAB_0010f7f6;
          goto LAB_0010f937;
        }
        if (bVar1 == 0x2d || (int)(char)bVar1 - 0x30U < 10) {
          pVVar17 = (pointer)0x0;
          pVVar5 = (pointer)0x3;
          do {
            pVVar24 = pVVar5;
            pVVar19 = pVVar17;
            pbVar21 = pbVar2;
            if (pcVar11 + (1 - (long)pbVar2) + (long)pVVar19 == (char *)0x0) goto LAB_0010fa7f;
            pVVar17 = (pointer)((long)&pVVar19->m_type + 1);
            pVVar5 = (pointer)((long)&pVVar24->m_type + 1);
          } while ((int)(pcVar11 + (long)(pcVar3 + 1))[(long)pVVar19] - 0x30U < 10);
          if ((pcVar11 + (long)(pcVar3 + 1))[(long)pVVar19] == '.') {
            if (pbVar2 <= pcVar11 + (long)((long)&pVVar17->m_type + 1)) goto LAB_0010fab6;
            if ((int)(char)((byte *)((long)&pVVar19->m_type + 2))[(long)(pcVar11 + (long)pcVar3)] -
                0x30U < 10) {
              pbVar20 = (byte *)(pcVar11 + (long)((long)&pVVar17->m_type + 2));
              pbVar21 = pbVar20;
              while( true ) {
                pVVar19 = pVVar17;
                if (pbVar2 <= pbVar20) goto LAB_0010fa7f;
                if (9 < (int)(pcVar11 + (long)pcVar3)[(long)pVVar24] - 0x30U) break;
                pbVar20 = (byte *)((long)&pVVar24->m_type + 1) + (long)pcVar11;
                pVVar24 = (pointer)((long)&pVVar24->m_type + 1);
                pbVar21 = pbVar2;
              }
              std::__cxx11::string::substr((ulong)local_c8,(ulong)jsonString);
              uVar15 = local_c8._0_8_;
              piVar13 = __errno_location();
              iVar23 = *piVar13;
              *piVar13 = 0;
              dVar4 = strtod((char *)uVar15,(char **)&local_60);
              uVar27 = SUB84(dVar4,0);
              uVar28 = (undefined4)((ulong)dVar4 >> 0x20);
              if (local_60._M_dataplus._M_p == (pointer)uVar15) {
                std::__throw_invalid_argument("stod");
LAB_0010facb:
                uVar15 = std::__throw_out_of_range("stod");
                std::__cxx11::_List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                _M_clear(&local_88);
                _Unwind_Resume(uVar15);
              }
              if (*piVar13 == 0) {
                *piVar13 = iVar23;
              }
              else if (*piVar13 == 0x22) goto LAB_0010facb;
              if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
                local_68 = dVar4;
                operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
                uVar27 = SUB84(local_68,0);
                uVar28 = (undefined4)((ulong)local_68 >> 0x20);
              }
              local_38 = (double)CONCAT44(uVar28,uVar27);
              p_Var12 = std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                        _M_create_node<double&>
                                  ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)
                                   &local_88,&local_38);
              pVVar17 = pVVar24;
              goto LAB_0010f6bc;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"exptected digit",0xf);
            __return_storage_ptr__ = local_40;
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
            std::ostream::put('P');
            std::ostream::flush();
            bVar26 = false;
            Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
            pcVar11 = pcVar11 + (long)((long)&pVVar17->m_type + 1);
          }
          else {
            std::__cxx11::string::substr((ulong)local_c8,(ulong)jsonString);
            uVar15 = local_c8._0_8_;
            piVar13 = __errno_location();
            local_68 = (double)CONCAT44(local_68._4_4_,*piVar13);
            *piVar13 = 0;
            lVar9 = strtol((char *)uVar15,(char **)&local_60,10);
            if (local_60._M_dataplus._M_p == (pointer)uVar15) goto LAB_0010faaa;
            if ((int)lVar9 != lVar9) goto LAB_0010fa9e;
            if (*piVar13 == 0x22) goto LAB_0010fa9e;
            if (*piVar13 == 0) {
              *piVar13 = local_68._0_4_;
            }
            if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
              operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
            }
            local_38 = (double)CONCAT44(local_38._4_4_,(int)lVar9);
            p_Var12 = std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                      _M_create_node<int&>
                                ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)
                                 &local_88,(int *)&local_38);
LAB_0010f6bc:
            std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
            local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
            bVar26 = true;
            pcVar11 = pcVar11 + (long)pVVar17;
            __return_storage_ptr__ = local_40;
          }
          if (bVar26) goto LAB_0010f7f6;
          goto LAB_0010f937;
        }
        if (0x6d < bVar1) {
          if (bVar1 == 0x6e) {
            iVar23 = std::__cxx11::string::compare((ulong)jsonString,(ulong)pcVar11,(char *)0x4);
            if (iVar23 == 0) {
              local_c8._0_8_ = (pointer)0x0;
              std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
              emplace_back<decltype(nullptr)>
                        ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_88,
                         (void **)local_c8);
LAB_0010f7ef:
              pcVar11 = pcVar11 + 4;
              goto LAB_0010f7f6;
            }
          }
          else {
            if (bVar1 != 0x74) goto LAB_0010f9f9;
            iVar23 = std::__cxx11::string::compare((ulong)jsonString,(ulong)pcVar11,(char *)0x4);
            if (iVar23 == 0) {
              local_c8[0] = 1;
              p_Var12 = std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                        _M_create_node<bool>
                                  ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                   &local_88,(bool *)local_c8);
              std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
              local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
              goto LAB_0010f7ef;
            }
          }
LAB_0010f65f:
          pcVar11 = pcVar11 + 1;
          goto LAB_0010f7f6;
        }
        if (bVar1 == 0x5b) {
          std::__cxx11::string::substr((ulong)local_c8,(ulong)jsonString);
          pcVar18 = pcVar11;
          if ((double)local_c8._8_8_ == 0.0) {
            iVar25 = 0;
            iVar23 = 0;
          }
          else {
            iVar23 = 0;
            iVar25 = 0;
            puVar16 = (undefined1 *)0x0;
            do {
              iVar23 = (uint)(*(char *)(local_c8._0_8_ + (long)puVar16) == '[') + iVar23;
              iVar25 = (uint)(*(char *)(local_c8._0_8_ + (long)puVar16) == ']') + iVar25;
              pcVar18 = pcVar18 + (iVar23 != iVar25);
              if (iVar23 == iVar25) break;
              bVar26 = (undefined1 *)(local_c8._8_8_ + -1) != puVar16;
              puVar16 = puVar16 + 1;
            } while (bVar26);
          }
          if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
            operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
          }
          if (iVar23 == iVar25) {
            std::__cxx11::string::substr((ulong)&local_60,(ulong)jsonString);
            arrayFromString((Value *)local_c8,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            p_Var12 = std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                      _M_create_node<ccd::Json::Value>
                                ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                 &local_88,(Value *)local_c8);
            std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
            local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
            pcVar11 = pcVar18 + 1;
            std::__detail::__variant::
            _Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
            ::~_Variant_storage((_Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                                 *)(local_c8 + 8));
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"could not tell end of new subObject",0x23);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
            std::ostream::put('P');
            std::ostream::flush();
            Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          }
          if (iVar23 == iVar25) goto LAB_0010f7f6;
          goto LAB_0010f937;
        }
        if (bVar1 == 0x66) {
          iVar23 = std::__cxx11::string::compare((ulong)jsonString,(ulong)pcVar11,(char *)0x5);
          if (iVar23 != 0) goto LAB_0010f65f;
          local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
          std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
          emplace_back<bool>((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&local_88,
                             (bool *)local_c8);
          pcVar11 = pcVar11 + 5;
          goto LAB_0010f7f6;
        }
        pVVar6 = local_40;
        if (bVar1 != 0x5d) {
LAB_0010f9f9:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"invalid value ",0xe);
          if ((char *)jsonString->_M_string_length <= pcVar11) {
LAB_0010fa8d:
            do {
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                         pcVar11);
LAB_0010fa9e:
              std::__throw_out_of_range("stoi");
LAB_0010faaa:
              std::__throw_invalid_argument("stoi");
LAB_0010fab6:
              pVVar19 = pVVar17;
              pbVar21 = (byte *)(pcVar11 + (long)((long)&pVVar17->m_type + 1));
LAB_0010fa7f:
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                         pbVar21);
              pVVar17 = pVVar19;
            } while( true );
          }
          local_c8[0] = pcVar11[(long)(jsonString->_M_dataplus)._M_p];
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_c8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," offset ",8);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(jsonString->_M_dataplus)._M_p,jsonString->_M_string_length);
          std::endl<char,std::char_traits<char>>(poVar14);
LAB_0010f9e1:
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          goto LAB_0010f937;
        }
        break;
      }
      lVar9 = std::__cxx11::string::find(cVar22,0x22);
      if (lVar9 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"cant find end of value",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
      }
      else {
        std::__cxx11::string::substr((ulong)local_c8,(ulong)jsonString);
        p_Var12 = std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                  _M_create_node<std::__cxx11::string>
                            ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c8);
        std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
        local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
        if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
          operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
        }
        pcVar11 = (char *)(lVar9 + 1);
      }
      if (lVar9 == -1) goto LAB_0010f937;
LAB_0010f7f6:
      local_b8._0_4_ = 0xd0a0920;
      local_c8._8_8_ = 1.97626258336499e-323;
      local_b8._4_4_ = local_b8._4_4_ & 0xffffff00;
      local_c8._0_8_ = (pointer)local_b8;
      pcVar11 = (char *)std::__cxx11::string::find_first_not_of
                                  ((char *)jsonString,(ulong)local_b8,(ulong)pcVar11);
      if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
        operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
      }
      pVVar17 = (pointer)local_b8;
      if ((char *)jsonString->_M_string_length <= pcVar11) goto LAB_0010fa8d;
      if (pcVar11[(long)(jsonString->_M_dataplus)._M_p] != ',') {
        pVVar6 = local_40;
        if (pcVar11[(long)(jsonString->_M_dataplus)._M_p] != ']') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"syntax error!",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          std::__cxx11::string::substr((ulong)local_c8,(ulong)jsonString);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_c8._0_8_,local_c8._8_8_);
          if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
            operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
          }
          goto LAB_0010f9e1;
        }
        break;
      }
      pVVar17 = (pointer)local_b8;
      local_b8._0_4_ = 0xd0a0920;
      local_c8._8_8_ = 1.97626258336499e-323;
      local_b8._4_4_ = local_b8._4_4_ & 0xffffff00;
      local_c8._0_8_ = pVVar17;
      pcVar11 = (char *)std::__cxx11::string::find_first_not_of
                                  ((char *)jsonString,(ulong)pVVar17,(ulong)(pcVar11 + 1));
      pVVar7 = local_40;
      pVVar6 = local_40;
      if ((pointer)local_c8._0_8_ != pVVar17) {
        operator_delete((void *)local_c8._0_8_,CONCAT44(local_b8._4_4_,local_b8._0_4_) + 1);
        pVVar7 = local_40;
        pVVar6 = local_40;
      }
    }
    local_40 = pVVar6;
    std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
    vector<std::move_iterator<std::_List_iterator<ccd::Json::Value>>,void>
              ((vector<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)local_c8,
               (move_iterator<std::_List_iterator<ccd::Json::Value>_>)
               local_88._M_impl._M_node.super__List_node_base._M_next,
               (move_iterator<std::_List_iterator<ccd::Json::Value>_>)&local_88,
               (allocator_type *)&local_60);
    Value::Value(__return_storage_ptr__,(Array *)local_c8);
    std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::~vector
              ((vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)local_c8);
  }
LAB_0010f937:
  std::__cxx11::_List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::_M_clear(&local_88)
  ;
  return __return_storage_ptr__;
}

Assistant:

Value arrayFromString(const std::string& jsonString)
{
	// make shure that decimal delimiter is a dot '.'
	std::setlocale(LC_NUMERIC, "C");

	auto arrayValues = std::list<Value>{};

	// check the borders
	auto beginPos = jsonString.find_first_of('[');
	auto endPos = jsonString.find_last_of(']');

	// if borders can not be defined something is wrong
	if (beginPos == string::npos || endPos == string::npos) {
		cout << "can't tell beginning or end of array" << endl;
		return nullptr;
	}

	// offset is one position after the beginning border
	auto offset = beginPos + 1;

	// find the first character
	beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

	// if no usefull character could be found position is set to npos
	while (beginPos != string::npos) {
		offset = beginPos;
		// it could be ne new sub object
		if (jsonString.at(offset) == '{') {
			auto newBeginPos = offset;
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '{')
					openCount++;
				if (character == '}')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}

			// if everything went right, set the dataName and start a new
			// objectFromJson querry recursively
			auto subObject = objectFromString(jsonString.substr(newBeginPos,
				newEndPos - newBeginPos + 1));
			if (subObject.type() == Value::Type::Null) {
				std::cout << "subObject ist nullptr" << std::endl;
				return nullptr;
			}
			arrayValues.push_back(move(subObject));
			// set the offset to one position after the closing curly braces 
			offset = newEndPos + 1;
		}
		// it could be a string value
		else if (jsonString.at(offset) == '"') {
			// find the value borders
			auto beginOfValue = offset + 1;
			auto endOfValue = jsonString.find_first_of('"', offset + 1);
			if (endOfValue == string::npos) {
				cout << "cant find end of value" << endl;
				return nullptr;
			}

			// save the found value
			auto value = jsonString.substr(beginOfValue, endOfValue - beginOfValue);

			// add the found data to the object struct map
			arrayValues.emplace_back(move(value));

			// set the offset to one position after the end of value
			offset = endOfValue + 1;
		}
		// it could be a numerical value
		else if (isdigit(jsonString.at(offset)) || (jsonString.at(offset) == '-')) {
			auto tempPos = offset;
			offset++;
			while (isdigit(jsonString.at(offset))) {
				offset++;
			}

			if (jsonString.at(offset) == '.') {
				offset++;

				if (!isdigit(jsonString.at(offset))) {
					std::cout << "exptected digit" << std::endl;
					return nullptr;
				}
				offset++;
				while (isdigit(jsonString.at(offset))) {
					offset++;
				}
				//save the found double
				auto value = stod(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
			else {
				// save the found int
				auto value = stoi(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
		}
		//it could be an array
		else if (jsonString.at(offset) == '[') {
			
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '[')
					openCount++;
				if (character == ']')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}
			auto value = arrayFromString(jsonString.substr(offset));
			arrayValues.push_back(move(value));

			offset = newEndPos + 1;
		}
		else if (jsonString.at(offset) == ']') {
			break;
		}
		else if (jsonString.at(offset) == 't') {
			if (jsonString.compare(offset, 4, "true") == 0) {
				arrayValues.emplace_back(true);
				offset += 4;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'f') {
			if (jsonString.compare(offset, 5, "false") == 0) {
				arrayValues.emplace_back(false);
				offset += 5;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'n') {
			if (jsonString.compare(offset, 4, "null") == 0) {
				arrayValues.emplace_back(nullptr);
				offset += 4;
			}
			else
				offset++;
		}
		else {
			cout 	<< "invalid value " << jsonString.at(offset) 
				<< " offset " << offset << endl
				<< jsonString << std::endl;
			return nullptr;
		}

		// find the next character
		offset = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

		// is it a closing curly braces we reached the end of the object and we are done
		if (jsonString.at(offset) == ']')
			break;
		// if a comma is next more values are following
		else if (jsonString.at(offset) == ',') {
			beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset + 1);
			continue;
		}
		// else syntax error
		else {
			std::cout << "syntax error!" << std::endl;
			std::cout << jsonString.substr(offset);
			return nullptr;
		}
	}

	return Array { 
		std::make_move_iterator(std::begin(arrayValues)),
		std::make_move_iterator(std::end(arrayValues))
	};
}